

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_miniscript_and_v
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  size_t indexes [2];
  
  indexes[0] = 0;
  indexes[1] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,indexes,(uchar *)0x0,0,(uchar *)0x0,0,
                     (uchar *)0x0,0,(uchar *)0x0,0,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_and_v(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    /* [X] [Y] */
    const size_t indexes[] = {0, 1};
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        NULL,
        0,
        NULL,
        0,
        NULL,
        0,
        NULL,
        0,
        script,
        script_len,
        write_len);
}